

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logic_program.cpp
# Opt level: O1

LogicProgram * __thiscall Clasp::Asp::LogicProgram::addRule(LogicProgram *this,Rule *rule)

{
  undefined1 *puVar1;
  RuleBuilder *out;
  int *piVar2;
  int iVar3;
  uint uVar4;
  size_t sVar5;
  bool bVar6;
  uint64 uVar7;
  Impl *this_00;
  long lVar8;
  uint *puVar9;
  RuleTransform tm;
  Rule sRule;
  SRule meta;
  RuleTransform local_80;
  Rule_t local_78;
  SRule local_3c;
  
  if ((this->super_ProgramBuilder).frozen_ == true) {
    Potassco::fail(-2,"LogicProgram &Clasp::Asp::LogicProgram::addRule(const Rule &)",0x312,
                   "!frozen()","Can\'t update frozen program!",0);
  }
  local_3c.hash = 0;
  local_3c.pos = 0;
  local_3c.bid = 0x40000000;
  out = &this->rule_;
  bVar6 = simplifyRule(this,rule,out,&local_3c);
  if (!bVar6) goto LAB_0013f24b;
  Potassco::RuleBuilder::rule(&local_78,out);
  piVar2 = (int *)(&(this->super_ProgramBuilder).field_0x1c +
                  (local_78._0_8_ & 0xffffffff) * 4 + (long)this->statsId_ * 0x14);
  *piVar2 = *piVar2 + 1;
  bVar6 = handleNatively(this,&local_78);
  if (bVar6) {
    addRule(this,&local_78,&local_3c);
    goto LAB_0013f24b;
  }
  *(int *)(&this->field_0x44 + (ulong)local_78.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
       *(int *)(&this->field_0x44 + (ulong)local_78.bt.val_ * 4 + (long)this->statsId_ * 0xc) + 1;
  if (((local_78.head.size < 2) && (local_78.bt.val_ != Normal)) &&
     (local_78.ht.val_ == Disjunctive)) {
    if (local_78.field_3.agg.bound == 1) {
LAB_0013f15e:
      iVar3 = this->statsId_;
      this->statsId_ = 1;
      RuleTransform::RuleTransform(&local_80,this);
      *(int *)(&this->field_0x44 + (ulong)local_78.bt.val_ * 4 + (long)this->statsId_ * 0xc) =
           *(int *)(&this->field_0x44 + (ulong)local_78.bt.val_ * 4 + (long)this->statsId_ * 0xc) +
           -1;
      piVar2 = (int *)(&(this->super_ProgramBuilder).field_0x1c +
                      (ulong)(rule->ht).val_ * 4 + (long)this->statsId_ * 0x14);
      *piVar2 = *piVar2 + -1;
      RuleTransform::transform(&local_80,&local_78,strategy_no_aux);
      this->statsId_ = iVar3;
      RuleTransform::~RuleTransform(&local_80);
      goto LAB_0013f24b;
    }
    if (local_78.field_3.cond.size < 7) {
      uVar7 = choose((uint)local_78.field_3.cond.size,local_78.field_3.agg.bound);
      if (uVar7 < 0x10) goto LAB_0013f15e;
    }
  }
  if (local_78.head.size != 0) {
    lVar8 = 0;
    do {
      resize(this,*(Atom_t *)((long)local_78.head.first + lVar8));
      lVar8 = lVar8 + 4;
    } while (local_78.head.size << 2 != lVar8);
  }
  this_00 = (Impl *)operator_new(0x10);
  Potassco::RuleBuilder::RuleBuilder((RuleBuilder *)this_00,out);
  local_80.impl_ = this_00;
  bk_lib::pod_vector<Potassco::RuleBuilder_*,_std::allocator<Potassco::RuleBuilder_*>_>::push_back
            (&this->extended_,(RuleBuilder **)&local_80);
LAB_0013f24b:
  if ((this->statsId_ == 0) && (sVar5 = (rule->head).size, sVar5 != 0)) {
    puVar9 = (rule->head).first;
    lVar8 = sVar5 << 2;
    do {
      uVar4 = *puVar9;
      if ((this->input_).lo <= uVar4) {
        if (uVar4 < (this->atoms_).ebo_.size) {
          puVar1 = &((this->atoms_).ebo_.buf[uVar4]->super_PrgHead).field_0x18;
          *(uint *)puVar1 = *(uint *)puVar1 | 0x8000000;
        }
        else {
          local_78._0_8_ = &this->auxData_->skippedHeads;
          std::
          _Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
          ::
          _M_insert<unsigned_int_const&,std::__detail::_AllocNode<std::allocator<std::__detail::_Hash_node<unsigned_int,false>>>>
                    ((_Hashtable<unsigned_int,unsigned_int,std::allocator<unsigned_int>,std::__detail::_Identity,std::equal_to<unsigned_int>,std::hash<unsigned_int>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,true,true>>
                      *)local_78._0_8_,puVar9,&local_78);
        }
      }
      puVar9 = puVar9 + 1;
      lVar8 = lVar8 + -4;
    } while (lVar8 != 0);
  }
  Potassco::RuleBuilder::clear(out);
  return this;
}

Assistant:

LogicProgram& LogicProgram::addRule(const Rule& rule) {
	check_not_frozen();
	SRule meta;
	if (simplifyRule(rule, rule_, meta)) {
		Rule sRule = rule_.rule();
		upStat(sRule.ht);
		if (handleNatively(sRule)) { // and can be handled natively
			addRule(sRule, meta);
		}
		else {
			upStat(sRule.bt);
			if (Potassco::size(sRule.head) <= 1 && transformNoAux(sRule)) {
				// rule transformation does not require aux atoms - do it now
				int oId  = statsId_;
				statsId_ = 1;
				RuleTransform tm(*this);
				upStat(sRule.bt, -1);
				upStat(rule.ht, -1);
				tm.transform(sRule, RuleTransform::strategy_no_aux);
				statsId_ = oId;
			}
			else {
				// make sure we have all head atoms
				for (Potassco::AtomSpan::iterator it = Potassco::begin(sRule.head), end = Potassco::end(sRule.head); it != end; ++it) {
					resize(*it);
				}
				extended_.push_back(new RuleBuilder(rule_));
			}
		}
	}
	if (statsId_ == 0) {
		// Assume all (new) heads are initially in "upper" closure.
		for (Potassco::AtomSpan::iterator it = Potassco::begin(rule.head), end = Potassco::end(rule.head); it != end; ++it) {
			if (!isNew(*it)) continue;
			if (validAtom(*it))
				getAtom(*it)->setInUpper(true);
			else
				auxData_->skippedHeads.insert(*it);
		}
	}
	rule_.clear();
	return *this;
}